

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrassembly.cpp
# Opt level: O0

void __thiscall
TPZDohrAssembly<long_double>::Assemble
          (TPZDohrAssembly<long_double> *this,int isub,TPZFMatrix<long_double> *local,
          TPZFMatrix<long_double> *global)

{
  int iVar1;
  int iVar2;
  TPZVec<int> *this_00;
  int64_t iVar3;
  longdouble *plVar4;
  TPZBaseMatrix *in_RDX;
  int in_ESI;
  long in_RDI;
  unkbyte10 in_ST0;
  unkbyte10 in_ST1;
  unkbyte10 in_ST2;
  unkbyte10 in_ST3;
  unkbyte10 in_ST4;
  unkbyte10 in_ST5;
  unkbyte10 in_ST6;
  int ic;
  int ieq;
  int ncols;
  int neq;
  TPZVec<int> *avec;
  undefined4 local_44;
  undefined6 uVar5;
  undefined2 in_stack_ffffffffffffffc6;
  int iVar6;
  int iVar7;
  
  this_00 = TPZVec<TPZVec<int>_>::operator[]((TPZVec<TPZVec<int>_> *)(in_RDI + 8),(long)in_ESI);
  iVar3 = TPZVec<int>::NElements(this_00);
  iVar1 = (int)iVar3;
  iVar3 = TPZBaseMatrix::Cols(in_RDX);
  iVar2 = (int)iVar3;
  for (iVar6 = 0; iVar6 < iVar2; iVar6 = iVar6 + 1) {
    for (iVar7 = 0; iVar7 < iVar1; iVar7 = iVar7 + 1) {
      (*(in_RDX->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDX,(long)iVar7,(long)iVar6);
      local_44 = (undefined4)in_ST0;
      uVar5 = (undefined6)((unkuint10)in_ST0 >> 0x20);
      TPZVec<int>::operator[](this_00,(long)iVar7);
      plVar4 = TPZFMatrix<long_double>::operator()
                         ((TPZFMatrix<long_double> *)CONCAT44(iVar1,iVar2),CONCAT44(iVar7,iVar6),
                          CONCAT26(in_stack_ffffffffffffffc6,uVar5));
      *plVar4 = *plVar4 + (longdouble)CONCAT64(uVar5,local_44);
      in_ST0 = in_ST1;
      in_ST1 = in_ST2;
      in_ST2 = in_ST3;
      in_ST3 = in_ST4;
      in_ST4 = in_ST5;
      in_ST5 = in_ST6;
    }
  }
  return;
}

Assistant:

void TPZDohrAssembly<TVar>::Assemble(int isub, const TPZFMatrix<TVar> &local, TPZFMatrix<TVar> &global) const
{
	TPZVec<int> &avec = fFineEqs[isub];
	int neq = avec.NElements();
    int ncols = local.Cols();
	int ieq;
    for (int ic=0; ic<ncols; ic++) 
    {
        for(ieq=0; ieq<neq; ieq++)
        {
            global(avec[ieq],ic) += local.GetVal(ieq,ic);
        }
    }
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Assembling destination indices " << avec << std::endl;
		local.Print("Input vector",sout);
		global.Print("Resulting vector",sout);
		if (logger.isDebugEnabled())
		{
			LOGPZ_DEBUG(logger, sout.str());
		}
	}
#endif
}